

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

bool __thiscall slang::ast::BinaryAssertionExpr::admitsEmptyImpl(BinaryAssertionExpr *this)

{
  bool bVar1;
  bool local_2a;
  bool local_29;
  BinaryAssertionExpr *this_local;
  
  switch(this->op) {
  case And:
  case Intersect:
  case Within:
    bVar1 = AssertionExpr::admitsEmpty(this->left);
    local_2a = false;
    if (bVar1) {
      local_2a = AssertionExpr::admitsEmpty(this->right);
    }
    this_local._7_1_ = local_2a;
    break;
  case Or:
    bVar1 = AssertionExpr::admitsEmpty(this->left);
    local_29 = true;
    if (!bVar1) {
      local_29 = AssertionExpr::admitsEmpty(this->right);
    }
    this_local._7_1_ = local_29;
    break;
  case Throughout:
    this_local._7_1_ = AssertionExpr::admitsEmpty(this->right);
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryAssertionExpr::admitsEmptyImpl() const {
    switch (op) {
        case BinaryAssertionOperator::Or:
            return left.admitsEmpty() || right.admitsEmpty();
        case BinaryAssertionOperator::And:
        case BinaryAssertionOperator::Intersect:
        case BinaryAssertionOperator::Within:
            return left.admitsEmpty() && right.admitsEmpty();
        case BinaryAssertionOperator::Throughout:
            return right.admitsEmpty();
        default:
            return false;
    }
}